

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<std::complex<double>_>::Subst_LForward
          (TPZMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *B)

{
  int iVar1;
  undefined4 extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  long lVar2;
  long lVar3;
  long lVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double in_XMM1_Qa;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_50;
  double local_48;
  complex<double> local_40;
  
  lVar4 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  if ((lVar4 != CONCAT44(extraout_var,iVar1)) || ((this->super_TPZBaseMatrix).fDecomposed != '\x04')
     ) {
    Error("TPZMatrix::Subst_LForward incompatible dimensions\n",(char *)0x0);
  }
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  if (CONCAT44(extraout_var_00,iVar1) != 0 && -1 < extraout_var_00) {
    lVar4 = 0;
    do {
      if (0 < (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol) {
        lVar2 = 0;
        do {
          if (lVar4 == 0) {
            local_78 = 0.0;
            dStack_70 = 0.0;
          }
          else {
            local_78 = 0.0;
            dStack_70 = 0.0;
            lVar3 = 0;
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,lVar4,lVar3);
              local_50 = in_XMM1_Qa;
              local_48 = extraout_XMM0_Qa;
              (*(B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(B,lVar3,lVar2);
              local_68 = local_48;
              dStack_60 = local_50;
              std::complex<double>::operator*=((complex<double> *)&local_68,&local_40);
              local_78 = local_78 + local_68;
              dStack_70 = dStack_70 + dStack_60;
              lVar3 = lVar3 + 1;
            } while (lVar4 != lVar3);
          }
          (*(B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(B,lVar4,lVar2);
          local_68 = extraout_XMM0_Qa_00 - local_78;
          dStack_60 = in_XMM1_Qa - dStack_70;
          (*(B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x23])(B,lVar4,lVar2,(complex<double> *)&local_68);
          lVar2 = lVar2 + 1;
        } while (lVar2 < (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol);
      }
      lVar4 = lVar4 + 1;
      iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    } while (lVar4 < CONCAT44(extraout_var_01,iVar1));
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_LForward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ELDLt) {
		Error("TPZMatrix::Subst_LForward incompatible dimensions\n");
	}
    for ( int64_t r = 0; r < Dim(); r++ ) {
        for ( int64_t c = 0; c < B->Cols();  c++ )    {
            // Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
            //
            TVar sum = 0.0;
            for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
            // Faz B[r,c] = (B[r,c] - sum) / A[r,r].
            //
            B->PutVal( r, c, B->GetVal(r, c) - sum );
        }
    }
    return( 1 );
}